

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O3

string * choc::text::trim(string *__return_storage_ptr__,string *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  long lVar3;
  size_type *psVar4;
  size_type sVar5;
  size_type *psVar6;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  size_type *local_30;
  size_type local_28;
  size_type local_20;
  undefined8 uStack_18;
  
  local_30 = &local_20;
  local_30 = (size_type *)(text->_M_dataplus)._M_p;
  paVar1 = &text->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30 == paVar1) {
    local_20 = paVar1->_M_allocated_capacity;
    uStack_18 = *(undefined8 *)((long)&text->field_2 + 8);
    local_30 = &local_20;
  }
  else {
    local_20 = paVar1->_M_allocated_capacity;
  }
  sVar5 = text->_M_string_length;
  local_28 = sVar5;
  (text->_M_dataplus)._M_p = (pointer)paVar1;
  text->_M_string_length = 0;
  (text->field_2)._M_local_buf[0] = '\0';
  if (sVar5 != 0) {
    psVar6 = &local_28;
    do {
      bVar2 = *(byte *)((long)local_30 + (sVar5 - 1));
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        local_28 = sVar5;
        *(byte *)((long)local_30 + sVar5) = 0;
        local_50 = &local_40;
        if (local_30 == &local_20) {
          local_40 = local_20;
          uStack_38 = uStack_18;
        }
        else {
          local_40 = local_20;
          local_50 = local_30;
        }
        local_40 = local_20;
        local_30 = &local_20;
        psVar4 = &local_20;
        local_48 = sVar5;
        goto LAB_001d9e23;
      }
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  local_50 = &local_40;
  psVar6 = &local_48;
  psVar4 = local_50;
LAB_001d9e23:
  *psVar6 = 0;
  *(byte *)psVar4 = 0;
  if (local_48 != 0) {
    if ((4 < (byte)*local_50 - 9) && ((byte)*local_50 != 0x20)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_50 == &local_40) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_38;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_50;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
      }
      __return_storage_ptr__->_M_string_length = local_48;
      local_48 = 0;
      local_40 = local_40 & 0xffffffffffffff00;
      goto LAB_001d9e77;
    }
    if (local_48 != 1) {
      lVar3 = local_48 - 1;
      psVar6 = local_50;
      do {
        psVar6 = (size_type *)((long)psVar6 + 1);
        if ((4 < *(byte *)psVar6 - 9) && (*(byte *)psVar6 != 0x20)) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    ((string *)__return_storage_ptr__,psVar6,(byte *)((long)local_50 + local_48));
          goto LAB_001d9e60;
        }
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_001d9e60:
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
LAB_001d9e77:
  if (local_30 != &local_20) {
    operator_delete(local_30,local_20 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string      trim (std::string      text)    { return trimStart (trimEnd (std::move (text))); }